

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall Catch::JunitReporter::writeAssertions(JunitReporter *this,SectionNode *sectionNode)

{
  bool bVar1;
  long in_RSI;
  vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_> *in_RDI;
  AssertionStats *assertion;
  const_iterator __end1;
  const_iterator __begin1;
  Assertions *__range1;
  AssertionStats *in_stack_00000248;
  JunitReporter *in_stack_00000250;
  reference in_stack_ffffffffffffffd0;
  __normal_iterator<const_Catch::AssertionStats_*,_std::vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>_>
  local_20;
  long local_18;
  
  local_18 = in_RSI + 0xa0;
  local_20._M_current =
       (AssertionStats *)
       clara::std::vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>::begin
                 (in_RDI);
  clara::std::vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>::end(in_RDI);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<const_Catch::AssertionStats_*,_std::vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>_>
                        *)in_stack_ffffffffffffffd0,
                       (__normal_iterator<const_Catch::AssertionStats_*,_std::vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>_>
                        *)in_RDI);
    if (!bVar1) break;
    in_stack_ffffffffffffffd0 =
         __gnu_cxx::
         __normal_iterator<const_Catch::AssertionStats_*,_std::vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>_>
         ::operator*(&local_20);
    writeAssertion(in_stack_00000250,in_stack_00000248);
    __gnu_cxx::
    __normal_iterator<const_Catch::AssertionStats_*,_std::vector<Catch::AssertionStats,_std::allocator<Catch::AssertionStats>_>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

void JunitReporter::writeAssertions( SectionNode const& sectionNode ) {
        for( auto const& assertion : sectionNode.assertions )
            writeAssertion( assertion );
    }